

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.hpp
# Opt level: O1

void czh::utils::fill_exponent(int K,string *buffer)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  byte bVar4;
  
  uVar3 = (ulong)(uint)K;
  if (K < 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (buffer,'-');
    uVar3 = (ulong)(uint)-K;
  }
  uVar2 = (uint)uVar3;
  if ((int)uVar2 < 100) {
    if ((int)uVar2 < 10) {
      bVar1 = (char)uVar3 + 0x30;
      goto LAB_0010fa29;
    }
    bVar4 = (byte)(uVar3 / 10);
    bVar1 = (char)(uVar3 / 10) + 0x30;
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (buffer,(char)(uVar3 / 100) + '0');
    uVar2 = uVar2 + (int)(uVar3 / 100) * -100;
    bVar4 = (byte)((ulong)uVar2 * 0x1999999a >> 0x20);
    bVar1 = bVar4 | 0x30;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (buffer,bVar1);
  bVar1 = (char)uVar2 + bVar4 * -10 | 0x30;
LAB_0010fa29:
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (buffer,bVar1);
  return;
}

Assistant:

void fill_exponent(int K, std::string &buffer)
  {
    if (K < 0)
    {
      buffer += '-';
      K = -K;
    }
  
    if (K >= 100)
    {
      buffer += static_cast<char>(static_cast<int>('0') + K / 100);
      K %= 100;
      buffer += static_cast<char>(static_cast<int>('0') + K / 10);
      K %= 10;
      buffer += static_cast<char>(static_cast<int>('0') + K);
    }
    else if (K >= 10)
    {
      buffer += static_cast<char>(static_cast<int>('0') + K / 10);
      K %= 10;
      buffer += static_cast<char>(static_cast<int>('0') + K);
    }
    else
      buffer += static_cast<char>(static_cast<int>('0') + K);
  }